

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  ulong uVar1;
  byte bVar2;
  uchar *puVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  int iVar7;
  cJSON_bool cVar8;
  lconv *plVar9;
  long lVar10;
  cJSON *item_00;
  cJSON *item_01;
  byte bVar11;
  uint uVar12;
  cJSON *pcVar13;
  cJSON *pcVar14;
  bool bVar15;
  double dVar16;
  uchar *after_end;
  byte *local_80;
  byte local_78 [72];
  
  if (input_buffer == (parse_buffer *)0x0) {
    return 0;
  }
  puVar3 = input_buffer->content;
  if (puVar3 == (uchar *)0x0) {
    return 0;
  }
  uVar4 = input_buffer->length;
  uVar5 = input_buffer->offset;
  uVar1 = uVar5 + 4;
  if ((uVar1 <= uVar4) && (iVar7 = strncmp((char *)(puVar3 + uVar5),"null",4), iVar7 == 0)) {
    item->type = 4;
LAB_00102875:
    input_buffer->offset = uVar1;
    return 1;
  }
  if ((uVar5 + 5 <= uVar4) && (iVar7 = strncmp((char *)(puVar3 + uVar5),"false",5), iVar7 == 0)) {
    item->type = 1;
    input_buffer->offset = uVar5 + 5;
    return 1;
  }
  if ((uVar1 <= uVar4) && (iVar7 = strncmp((char *)(puVar3 + uVar5),"true",4), iVar7 == 0)) {
    item->type = 2;
    item->valueint = 1;
    goto LAB_00102875;
  }
  if (uVar4 <= uVar5) {
    return 0;
  }
  if (puVar3[uVar5] == '\"') {
    cVar8 = parse_string(item,input_buffer);
    return cVar8;
  }
  if (uVar4 <= uVar5) {
    return 0;
  }
  if (puVar3[uVar5] == '-' || (byte)(puVar3[uVar5] - 0x30) < 10) {
    local_80 = (byte *)0x0;
    plVar9 = localeconv();
    puVar3 = input_buffer->content;
    if (puVar3 == (uchar *)0x0) {
      return 0;
    }
    bVar2 = *plVar9->decimal_point;
    uVar1 = input_buffer->length;
    sVar6 = input_buffer->offset;
    lVar10 = 0;
    do {
      if ((uVar1 <= sVar6 + lVar10) ||
         ((bVar11 = puVar3[lVar10 + sVar6], 9 < bVar11 - 0x30 &&
          ((uVar12 = bVar11 - 0x2b, 0x3a < uVar12 ||
           (((0x400000004000005U >> ((ulong)uVar12 & 0x3f) & 1) == 0 &&
            (bVar11 = bVar2, (ulong)uVar12 != 3)))))))) goto LAB_0010291e;
      local_78[lVar10] = bVar11;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x3f);
    lVar10 = 0x3f;
LAB_0010291e:
    local_78[lVar10] = 0;
    dVar16 = strtod((char *)local_78,(char **)&local_80);
    if (local_78 == local_80) {
      return 0;
    }
    item->valuedouble = dVar16;
    iVar7 = 0x7fffffff;
    if ((dVar16 < 2147483647.0) && (iVar7 = -0x80000000, -2147483648.0 < dVar16)) {
      iVar7 = (int)dVar16;
    }
    item->valueint = iVar7;
    item->type = 8;
    input_buffer->offset = (size_t)(local_80 + (input_buffer->offset - (long)local_78));
    return 1;
  }
  if (uVar4 <= uVar5) {
    return 0;
  }
  if (puVar3[uVar5] != '[') {
    if (uVar4 <= uVar5) {
      return 0;
    }
    if (puVar3[uVar5] == '{') {
      cVar8 = parse_object(item,input_buffer);
      return cVar8;
    }
    return 0;
  }
  if (999 < input_buffer->depth) {
    return 0;
  }
  input_buffer->depth = input_buffer->depth + 1;
  if (puVar3[uVar5] == '[') {
    input_buffer->offset = uVar5 + 1;
    buffer_skip_whitespace(input_buffer);
    uVar1 = input_buffer->offset;
    if (uVar1 < input_buffer->length) {
      if (input_buffer->content[uVar1] == ']') {
        item_01 = (cJSON *)0x0;
LAB_001028f3:
        item->type = 0x20;
        item->child = item_01;
        input_buffer->offset = input_buffer->offset + 1;
        input_buffer->depth = input_buffer->depth - 1;
        return 1;
      }
      if (uVar1 < input_buffer->length) {
        input_buffer->offset = uVar1 - 1;
        pcVar13 = (cJSON *)0x0;
        pcVar14 = (cJSON *)0x0;
        do {
          item_00 = (cJSON *)(*(input_buffer->hooks).allocate)(0x40);
          if (item_00 == (cJSON *)0x0) {
            bVar15 = false;
            item_01 = pcVar13;
            item_00 = pcVar14;
          }
          else {
            item_00->valuedouble = 0.0;
            item_00->string = (char *)0x0;
            item_00->valuestring = (char *)0x0;
            item_00->valueint = 0;
            *(undefined4 *)&item_00->field_0x2c = 0;
            item_00->child = (cJSON *)0x0;
            item_00->type = 0;
            *(undefined4 *)&item_00->field_0x1c = 0;
            item_00->next = (cJSON *)0x0;
            item_00->prev = (cJSON *)0x0;
            item_01 = item_00;
            if (pcVar13 != (cJSON *)0x0) {
              pcVar14->next = item_00;
              item_00->prev = pcVar14;
              item_01 = pcVar13;
            }
            input_buffer->offset = input_buffer->offset + 1;
            buffer_skip_whitespace(input_buffer);
            cVar8 = parse_value(item_00,input_buffer);
            bVar15 = cVar8 != 0;
            if (bVar15) {
              buffer_skip_whitespace(input_buffer);
            }
          }
          if (!bVar15) goto LAB_00102a8a;
          uVar1 = input_buffer->offset;
          if (input_buffer->length <= uVar1) goto LAB_00102a8a;
          pcVar13 = item_01;
          pcVar14 = item_00;
        } while (input_buffer->content[uVar1] == ',');
        if ((uVar1 < input_buffer->length) && (input_buffer->content[uVar1] == ']'))
        goto LAB_001028f3;
        goto LAB_00102a8a;
      }
    }
    input_buffer->offset = uVar1 - 1;
  }
  item_01 = (cJSON *)0x0;
LAB_00102a8a:
  if (item_01 != (cJSON *)0x0) {
    cJSON_Delete(item_01);
    return 0;
  }
  return 0;
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }


    return false;
}